

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

uint __thiscall Assimp::XGLImporter::ReadIndexFromText(XGLImporter *this)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  
  bVar2 = SkipToText(this);
  if (bVar2) {
    iVar3 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    pbVar4 = (byte *)CONCAT44(extraout_var,iVar3);
    while( true ) {
      uVar6 = (ulong)*pbVar4;
      if (0x20 < uVar6) break;
      if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) goto LAB_005a781c;
        break;
      }
      pbVar4 = pbVar4 + 1;
    }
    uVar5 = 0;
    pbVar7 = pbVar4;
    if (0xf5 < (byte)(*pbVar4 - 0x3a)) {
      uVar5 = 0;
      do {
        uVar5 = (uint)(byte)((char)uVar6 - 0x30) + uVar5 * 10;
        pbVar1 = pbVar7 + 1;
        uVar6 = (ulong)*pbVar1;
        pbVar7 = pbVar7 + 1;
      } while (0xf5 < (byte)(*pbVar1 - 0x3a));
    }
    if (pbVar4 != pbVar7) {
      return uVar5;
    }
  }
LAB_005a781c:
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5a7821);
  return 0xffffffff;
}

Assistant:

unsigned int XGLImporter::ReadIndexFromText()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading index element contents");
        return ~0u;
    }
    const char* s = m_reader->getNodeData(), *se;
    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse index element");
        return ~0u;
    }

    const unsigned int t = strtoul10(s,&se);

    if (se == s) {
        LogError("failed to read index");
        return ~0u;
    }

    return t;
}